

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::UploadUsingNamedBufferSubData
          (DataTest *this,GLuint id,GLenum parameter)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_pNamedBufferData)(id,0x34,(GLvoid *)0x0,parameter);
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"glNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x19c);
  (*this->m_pNamedBufferSubData)(id,0,0x34,s_reference);
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"glNamedBufferSubData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x19f);
  return;
}

Assistant:

void DataTest::UploadUsingNamedBufferSubData(glw::GLuint id, glw::GLenum parameter)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_pNamedBufferData(id, s_reference_size, DE_NULL, parameter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

	m_pNamedBufferSubData(id, 0, s_reference_size, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferSubData failed.");
}